

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  undefined8 *puVar1;
  int iVar2;
  pointer pBVar3;
  int *piVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Layer *pLVar9;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  uint uVar10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar11;
  int iVar12;
  long lVar13;
  void *__ptr;
  Mat *pMVar14;
  long lVar15;
  char *pcVar16;
  int *piVar17;
  size_t sVar18;
  ulong uVar19;
  int j;
  int iVar20;
  size_t sStack_150;
  int typeindex;
  char local_141;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  int top_count;
  int bottom_count;
  Layer *local_130;
  int blob_count;
  Mat *local_120;
  long local_118;
  int layer_count;
  vector<int,_std::allocator<int>_> *local_108;
  Net *local_100;
  vector<int,_std::allocator<int>_> *local_f8;
  ulong local_f0;
  ParamDict pd;
  int magic;
  Option *local_d0;
  DataReader *local_c8;
  int bottom_blob_index;
  undefined4 uStack_bc;
  int *local_b8;
  Allocator *local_a0;
  int local_88;
  size_t local_80;
  Option opt1;
  
  magic = 0;
  iVar8 = (*dr->_vptr_DataReader[3])(dr,&magic,4);
  if (CONCAT44(extraout_var,iVar8) == 4) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar8 = (*dr->_vptr_DataReader[3])(dr,&layer_count,4);
      if (CONCAT44(extraout_var_00,iVar8) == 4) {
        iVar8 = (*dr->_vptr_DataReader[3])(dr,&blob_count,4);
        if (CONCAT44(extraout_var_01,iVar8) == 4) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            local_d0 = &this->opt;
            uVar19 = 0;
            local_100 = this;
            local_c8 = dr;
            do {
              if ((long)layer_count <= (long)uVar19) {
                iVar8 = 0;
                NetPrivate::update_input_output_indexes(this->d);
LAB_001330f6:
                ParamDict::~ParamDict(&pd);
                return iVar8;
              }
              iVar8 = (*dr->_vptr_DataReader[3])(dr,&typeindex,4);
              if (CONCAT44(extraout_var_02,iVar8) != 4) {
                pcVar16 = "read typeindex failed";
LAB_001331e0:
                sStack_150 = 0x15;
LAB_001330df:
                fwrite(pcVar16,sStack_150,1,_stderr);
                fputc(10,_stderr);
LAB_001330f3:
                iVar8 = -1;
                goto LAB_001330f6;
              }
              iVar8 = (*dr->_vptr_DataReader[3])(dr,&bottom_count,4);
              if (CONCAT44(extraout_var_03,iVar8) != 4) {
                pcVar16 = "read bottom_count failed";
                sStack_150 = 0x18;
                goto LAB_001330df;
              }
              iVar8 = (*dr->_vptr_DataReader[3])(dr,&top_count,4);
              if (CONCAT44(extraout_var_04,iVar8) != 4) {
                pcVar16 = "read top_count failed";
                goto LAB_001331e0;
              }
              iVar8 = (*this->_vptr_Net[6])(this,(ulong)(uint)typeindex);
              pLVar9 = (Layer *)CONCAT44(extraout_var_05,iVar8);
              if ((pLVar9 == (Layer *)0x0) &&
                 (pLVar9 = create_layer_cpu(typeindex), pLVar9 == (Layer *)0x0)) {
                iVar8 = (*this->_vptr_Net[5])(this,(ulong)(typeindex & 0xfffffeff));
                pLVar9 = (Layer *)CONCAT44(extraout_var_06,iVar8);
                if (pLVar9 != (Layer *)0x0) goto LAB_001328c9;
                fprintf(_stderr,"layer %d not exists or registered",(ulong)(uint)typeindex);
                fputc(10,_stderr);
                clear(this);
                goto LAB_001330f3;
              }
LAB_001328c9:
              local_f8 = &pLVar9->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(local_f8,(long)bottom_count);
              local_130 = pLVar9;
              for (lVar13 = 0; lVar13 < bottom_count; lVar13 = lVar13 + 1) {
                iVar8 = (*dr->_vptr_DataReader[3])(dr,(Mat *)&bottom_blob_index,4);
                if (CONCAT44(extraout_var_07,iVar8) != 4) {
                  pcVar16 = "read bottom_blob_index failed";
                  sStack_150 = 0x1d;
                  goto LAB_001330df;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[bottom_blob_index].consumer = (int)uVar19;
                (local_f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = bottom_blob_index;
              }
              local_108 = &local_130->tops;
              std::vector<int,_std::allocator<int>_>::resize(local_108,(long)top_count);
              for (lVar13 = 0; lVar13 < top_count; lVar13 = lVar13 + 1) {
                iVar8 = (*dr->_vptr_DataReader[3])(dr,(Mat *)&bottom_blob_index,4);
                if (CONCAT44(extraout_var_08,iVar8) != 4) {
                  pcVar16 = "read top_blob_index failed";
                  sStack_150 = 0x1a;
                  goto LAB_001330df;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[bottom_blob_index].producer = (int)uVar19;
                (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar13] = bottom_blob_index;
              }
              local_141 = local_130->support_vulkan;
              iVar8 = ParamDict::load_param_bin(&pd,dr);
              if (iVar8 == 0) {
                opt1.lightmode = false;
                opt1.use_shader_pack8 = false;
                opt1.use_subgroup_ops = false;
                opt1.use_reserved_0 = false;
                opt1.num_threads = 0;
                opt1.blob_allocator._0_4_ = 0;
                opt1.blob_allocator._4_4_ = 0;
                opt1.workspace_allocator._0_4_ = 0;
                opt1._20_8_ = 0;
                opt1.flush_denormals = 0;
                opt1.use_local_pool_allocator = false;
                opt1.use_shader_local_memory = false;
                opt1.use_cooperative_matrix = false;
                opt1.use_winograd23_convolution = false;
                opt1.use_winograd43_convolution = false;
                opt1.use_winograd63_convolution = false;
                opt1.use_a53_a55_optimized_kernel = false;
                opt1.use_fp16_uniform = false;
                opt1.use_bf16_storage = false;
                opt1.use_fp16_packed = false;
                opt1.use_fp16_storage = false;
                opt1.use_fp16_arithmetic = false;
                opt1.use_int8_packed = false;
                opt1.use_int8_storage = false;
                opt1.use_int8_arithmetic = false;
                opt1.use_packing_layout = false;
                opt1.vulkan_device_index = 0;
                opt1.use_reserved_1 = false;
                opt1.use_image_storage = false;
                opt1.use_tensor_storage = false;
                opt1.use_reserved_2 = false;
                ParamDict::get((Mat *)&bottom_blob_index,&pd,0x1e,(Mat *)&opt1);
                piVar17 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
                if (piVar17 != (int *)0x0) {
                  LOCK();
                  *piVar17 = *piVar17 + -1;
                  UNLOCK();
                  if (*piVar17 == 0) {
                    if (opt1._32_8_ == 0) {
                      free((void *)opt1._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)opt1._32_8_ + 0x18))();
                    }
                  }
                }
                local_f0 = uVar19;
                if ((CONCAT44(uStack_bc,bottom_blob_index) != 0) && ((long)local_88 * local_80 != 0)
                   ) {
                  piVar17 = (int *)(CONCAT44(uStack_bc,bottom_blob_index) + 0xc);
                  for (lVar13 = 0; iVar8 = 1, lVar13 < top_count; lVar13 = lVar13 + 1) {
                    iVar2 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar13];
                    pBVar3 = (local_100->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar12 = piVar17[-3];
                    if (iVar12 == 3) {
                      uVar10 = piVar17[-2];
                      local_140 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(long)(int)uVar10
                      ;
                      iVar8 = piVar17[-1];
                      lVar15 = (long)iVar8;
                      iVar20 = *piVar17;
                      sVar18 = lVar15 * (long)local_140 + 3U & 0x3ffffffffffffffc;
                      pMVar14 = &pBVar3[iVar2].shape;
                      piVar4 = pBVar3[iVar2].shape.refcount;
                      if (piVar4 == (int *)0x0) {
LAB_00132c0a:
                        iVar12 = 3;
                      }
                      else {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 != 0) goto LAB_00132c0a;
                        __ptr = pBVar3[iVar2].shape.data;
                        pAVar5 = pBVar3[iVar2].shape.allocator;
                        local_118 = lVar15;
                        if (pAVar5 == (Allocator *)0x0) {
LAB_00132c22:
                          local_120 = &pBVar3[iVar2].shape;
                          free(__ptr);
                          uVar10 = (uint)local_140;
                          iVar8 = (int)local_118;
                          pMVar14 = local_120;
                        }
                        else {
                          local_120 = pMVar14;
                          (*pAVar5->_vptr_Allocator[3])();
                          iVar12 = 3;
                          uVar10 = (uint)local_140;
                          iVar8 = (int)local_118;
                          pMVar14 = local_120;
                        }
                      }
LAB_00132c3c:
                      pMVar14->data = (void *)0x0;
                      pMVar14->refcount = (int *)0x0;
                      pBVar3[iVar2].shape.elemsize = 4;
                      pBVar3[iVar2].shape.elempack = 1;
                      pBVar3[iVar2].shape.allocator = (Allocator *)0x0;
                      pBVar3[iVar2].shape.dims = iVar12;
                      pBVar3[iVar2].shape.w = uVar10;
                      pBVar3[iVar2].shape.h = iVar8;
                      pBVar3[iVar2].shape.d = 1;
                      pBVar3[iVar2].shape.c = iVar20;
                      pBVar3[iVar2].shape.cstep = sVar18;
                      uVar19 = local_f0;
                    }
                    else {
                      if (iVar12 == 2) {
                        uVar10 = piVar17[-2];
                        local_140 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                    (long)(int)uVar10;
                        iVar8 = piVar17[-1];
                        lVar15 = (long)iVar8;
                        sVar18 = lVar15 * (long)local_140;
                        piVar4 = pBVar3[iVar2].shape.refcount;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            __ptr = pBVar3[iVar2].shape.data;
                            pAVar5 = pBVar3[iVar2].shape.allocator;
                            local_118 = lVar15;
                            if (pAVar5 == (Allocator *)0x0) {
LAB_00132c1f:
                              iVar20 = 1;
                              goto LAB_00132c22;
                            }
                            local_120 = &pBVar3[iVar2].shape;
                            (*pAVar5->_vptr_Allocator[3])();
                            iVar12 = 2;
                            iVar20 = 1;
                            uVar10 = (uint)local_140;
                            iVar8 = (int)local_118;
                            pMVar14 = local_120;
                            goto LAB_00132c3c;
                          }
                        }
                        iVar20 = 2;
LAB_00132c13:
                        iVar12 = iVar20;
                        iVar20 = 1;
                        pMVar14 = &pBVar3[iVar2].shape;
                        goto LAB_00132c3c;
                      }
                      if (iVar12 == 1) {
                        uVar10 = piVar17[-2];
                        local_140 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(ulong)uVar10;
                        sVar18 = (size_t)(int)uVar10;
                        piVar4 = pBVar3[iVar2].shape.refcount;
                        iVar20 = iVar8;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            __ptr = pBVar3[iVar2].shape.data;
                            pAVar5 = pBVar3[iVar2].shape.allocator;
                            if (pAVar5 == (Allocator *)0x0) {
                              local_118 = 1;
                              goto LAB_00132c1f;
                            }
                            local_120 = &pBVar3[iVar2].shape;
                            (*pAVar5->_vptr_Allocator[3])();
                            iVar8 = 1;
                            iVar20 = 1;
                            uVar10 = (uint)local_140;
                            pMVar14 = local_120;
                            iVar12 = iVar8;
                            goto LAB_00132c3c;
                          }
                        }
                        goto LAB_00132c13;
                      }
                    }
                    piVar17 = piVar17 + 4;
                  }
                }
                local_140 = &local_130->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (local_140,(long)bottom_count);
                this = local_100;
                lVar13 = 0;
                pvVar11 = local_140;
                for (lVar15 = 0; lVar15 < bottom_count; lVar15 = lVar15 + 1) {
                  iVar8 = (local_f8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar15];
                  pBVar3 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar6 = (pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar1 = (undefined8 *)((long)&pMVar6->data + lVar13);
                  if ((Mat *)puVar1 != &pBVar3[iVar8].shape) {
                    piVar17 = pBVar3[iVar8].shape.refcount;
                    if (piVar17 != (int *)0x0) {
                      LOCK();
                      *piVar17 = *piVar17 + 1;
                      UNLOCK();
                    }
                    piVar17 = *(int **)((long)&pMVar6->refcount + lVar13);
                    if (piVar17 != (int *)0x0) {
                      LOCK();
                      *piVar17 = *piVar17 + -1;
                      UNLOCK();
                      if (*piVar17 == 0) {
                        plVar7 = *(long **)((long)&pMVar6->allocator + lVar13);
                        if (plVar7 == (long *)0x0) {
                          free(*(void **)((long)&pMVar6->data + lVar13));
                          pvVar11 = local_140;
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                          pvVar11 = local_140;
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar6->cstep + lVar13) = 0;
                    *(undefined8 *)((long)puVar1 + 0xc) = 0;
                    *(undefined8 *)((long)puVar1 + 0x14) = 0;
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)&pMVar6->c + lVar13) = 0;
                    puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar13);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    piVar17 = pBVar3[iVar8].shape.refcount;
                    puVar1 = (undefined8 *)((long)&pMVar6->data + lVar13);
                    *puVar1 = pBVar3[iVar8].shape.data;
                    puVar1[1] = piVar17;
                    *(size_t *)((long)&pMVar6->elemsize + lVar13) = pBVar3[iVar8].shape.elemsize;
                    *(int *)((long)&pMVar6->elempack + lVar13) = pBVar3[iVar8].shape.elempack;
                    *(Allocator **)((long)&pMVar6->allocator + lVar13) =
                         pBVar3[iVar8].shape.allocator;
                    iVar2 = pBVar3[iVar8].shape.w;
                    iVar12 = pBVar3[iVar8].shape.h;
                    iVar20 = pBVar3[iVar8].shape.d;
                    piVar17 = (int *)((long)&pMVar6->dims + lVar13);
                    *piVar17 = pBVar3[iVar8].shape.dims;
                    piVar17[1] = iVar2;
                    piVar17[2] = iVar12;
                    piVar17[3] = iVar20;
                    *(int *)((long)&pMVar6->c + lVar13) = pBVar3[iVar8].shape.c;
                    *(size_t *)((long)&pMVar6->cstep + lVar13) = pBVar3[iVar8].shape.cstep;
                  }
                  lVar13 = lVar13 + 0x48;
                  uVar19 = local_f0;
                }
                pvVar11 = &local_130->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar11,(long)top_count);
                lVar13 = 0;
                for (lVar15 = 0; lVar15 < top_count; lVar15 = lVar15 + 1) {
                  iVar8 = (local_108->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar15];
                  pBVar3 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar6 = (pvVar11->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar1 = (undefined8 *)((long)&pMVar6->data + lVar13);
                  if ((Mat *)puVar1 != &pBVar3[iVar8].shape) {
                    piVar17 = pBVar3[iVar8].shape.refcount;
                    if (piVar17 != (int *)0x0) {
                      LOCK();
                      *piVar17 = *piVar17 + 1;
                      UNLOCK();
                    }
                    piVar17 = *(int **)((long)&pMVar6->refcount + lVar13);
                    if (piVar17 != (int *)0x0) {
                      LOCK();
                      *piVar17 = *piVar17 + -1;
                      UNLOCK();
                      if (*piVar17 == 0) {
                        plVar7 = *(long **)((long)&pMVar6->allocator + lVar13);
                        if (plVar7 == (long *)0x0) {
                          free(*(void **)((long)&pMVar6->data + lVar13));
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar6->cstep + lVar13) = 0;
                    *(undefined8 *)((long)puVar1 + 0xc) = 0;
                    *(undefined8 *)((long)puVar1 + 0x14) = 0;
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)&pMVar6->c + lVar13) = 0;
                    puVar1 = (undefined8 *)((long)&pMVar6->dims + lVar13);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    piVar17 = pBVar3[iVar8].shape.refcount;
                    puVar1 = (undefined8 *)((long)&pMVar6->data + lVar13);
                    *puVar1 = pBVar3[iVar8].shape.data;
                    puVar1[1] = piVar17;
                    *(size_t *)((long)&pMVar6->elemsize + lVar13) = pBVar3[iVar8].shape.elemsize;
                    *(int *)((long)&pMVar6->elempack + lVar13) = pBVar3[iVar8].shape.elempack;
                    *(Allocator **)((long)&pMVar6->allocator + lVar13) =
                         pBVar3[iVar8].shape.allocator;
                    iVar2 = pBVar3[iVar8].shape.w;
                    iVar12 = pBVar3[iVar8].shape.h;
                    iVar20 = pBVar3[iVar8].shape.d;
                    piVar17 = (int *)((long)&pMVar6->dims + lVar13);
                    *piVar17 = pBVar3[iVar8].shape.dims;
                    piVar17[1] = iVar2;
                    piVar17[2] = iVar12;
                    piVar17[3] = iVar20;
                    *(int *)((long)&pMVar6->c + lVar13) = pBVar3[iVar8].shape.c;
                    *(size_t *)((long)&pMVar6->cstep + lVar13) = pBVar3[iVar8].shape.cstep;
                  }
                  lVar13 = lVar13 + 0x48;
                  this = local_100;
                  uVar19 = local_f0;
                }
                iVar8 = ParamDict::get(&pd,0x1f,0);
                local_130->featmask = iVar8;
                iVar8 = (*local_130->_vptr_Layer[2])(local_130,&pd);
                pLVar9 = local_130;
                if (iVar8 == 0) {
                  if (local_130->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  get_masked_option(&opt1,local_d0,local_130->featmask);
                  if ((local_141 != '\0') &&
                     ((pLVar9->support_vulkan != true || (opt1.use_vulkan_compute == false)))) {
                    iVar8 = (*this->_vptr_Net[6])(this,(ulong)(uint)typeindex);
                    pLVar9 = (Layer *)CONCAT44(extraout_var_09,iVar8);
                    if ((pLVar9 == (Layer *)0x0) &&
                       (pLVar9 = create_layer_cpu(typeindex), pLVar9 == (Layer *)0x0)) {
                      iVar8 = (*this->_vptr_Net[5])(this,(ulong)(typeindex & 0xfffffeff));
                      pLVar9 = (Layer *)CONCAT44(extraout_var_10,iVar8);
                      if (pLVar9 != (Layer *)0x0) goto LAB_00132f56;
                      fprintf(_stderr,"layer %d not exists or registered",(ulong)(uint)typeindex);
                      fputc(10,_stderr);
                      clear(this);
                      iVar8 = 1;
                      goto LAB_00132fcb;
                    }
LAB_00132f56:
                    std::vector<int,_std::allocator<int>_>::operator=(&pLVar9->bottoms,local_f8);
                    std::vector<int,_std::allocator<int>_>::operator=(&pLVar9->tops,local_108);
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                              (&pLVar9->bottom_shapes,local_140);
                    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=
                              (&pLVar9->top_shapes,pvVar11);
                    pLVar9->featmask = local_130->featmask;
                    iVar8 = (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
                    if (iVar8 != 0) goto LAB_0013302b;
                    (*local_130->_vptr_Layer[1])();
                  }
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar19] = pLVar9;
                  iVar8 = 0;
                }
                else {
LAB_0013302b:
                  fprintf(_stderr,"layer load_param %d failed",uVar19 & 0xffffffff);
                  fputc(10,_stderr);
                  iVar8 = 0xe;
                }
LAB_00132fcb:
                dr = local_c8;
                if (local_b8 != (int *)0x0) {
                  LOCK();
                  *local_b8 = *local_b8 + -1;
                  UNLOCK();
                  if (*local_b8 == 0) {
                    if (local_a0 == (Allocator *)0x0) {
                      free((void *)CONCAT44(uStack_bc,bottom_blob_index));
                    }
                    else {
                      (*local_a0->_vptr_Allocator[3])();
                    }
                  }
                }
                if ((iVar8 != 0xe) && (iVar8 != 0)) goto LAB_001330f3;
              }
              else {
                fprintf(_stderr,"ParamDict load_param_bin %d failed",uVar19 & 0xffffffff);
                fputc(10,_stderr);
              }
              uVar19 = uVar19 + 1;
            } while( true );
          }
          pcVar16 = "invalid layer_count or blob_count";
          sStack_150 = 0x21;
        }
        else {
          pcVar16 = "read blob_count failed";
          sStack_150 = 0x16;
        }
      }
      else {
        pcVar16 = "read layer_count failed";
        sStack_150 = 0x17;
      }
    }
    else {
      pcVar16 = "param is too old, please regenerate";
      sStack_150 = 0x23;
    }
  }
  else {
    pcVar16 = "read magic failed";
    sStack_150 = 0x11;
  }
  fwrite(pcVar16,sStack_150,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#if __BIG_ENDIAN__
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }                                              \
    if (sizeof(buf) == 2)                          \
        swap_endianness_16(&buf);                  \
    if (sizeof(buf) == 4)                          \
        swap_endianness_32(&buf);
#else
#define READ_VALUE(buf)                            \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    {                                              \
        NCNN_LOGE("read " #buf " failed");         \
        return -1;                                 \
    }
#endif

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize(layer_count);
    d->blobs.resize(blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev)
        {
            int device_index = opt.vulkan_device_index;
            if (device_index < 0 || device_index >= get_gpu_count())
                device_index = get_default_gpu_index();

            d->vkdev = get_gpu_device(device_index);
        }
        if (!d->vkdev || !d->vkdev->is_valid()) opt.use_vulkan_compute = false; // no valid vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_uniform()) opt.use_fp16_uniform = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_packed()) opt.use_int8_packed = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_uniform()) opt.use_int8_uniform = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;
        if (!d->vkdev->info.support_subgroup_ops()) opt.use_subgroup_ops = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        if (opt.use_image_storage && !d->vkdev->info.support_fp16_image())
        {
            opt.use_fp16_storage = false;
            opt.use_fp16_uniform = false;
        }

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;

        // fp16 uniform makes no sense when fp16 arithmetic disabled
        if (!opt.use_fp16_arithmetic) opt.use_fp16_uniform = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i = 0; i < layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_overwrite_builtin_layer(typeindex);
#if NCNN_VULKAN
        if (!layer && opt.use_vulkan_compute && d->vkdev)
        {
            layer = create_layer_vulkan(typeindex);
        }
#endif // NCNN_VULKAN
        if (!layer)
        {
            layer = create_layer_cpu(typeindex);
        }
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %d not exists or registered", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        //         layer->type = std::string(layer_type);
        //         layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = d->blobs[top_blob_index];

            //             blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        int layer_support_vulkan = layer->support_vulkan;

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param_bin %d failed", i);
            continue;
        }

        // pull out top blob shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d failed", i);
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (opt1.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        if (layer_support_vulkan && (!layer->support_vulkan || !opt1.use_vulkan_compute))
        {
            // vulkan layer cannot handle these param, recreate cpu layer
            Layer* layer_cpu = create_overwrite_builtin_layer(typeindex);
            if (!layer_cpu)
            {
                layer_cpu = create_layer_cpu(typeindex);
            }
            if (!layer_cpu)
            {
                int custom_index = typeindex & ~LayerType::CustomBit;
                layer_cpu = create_custom_layer(custom_index);
            }
            if (!layer_cpu)
            {
                NCNN_LOGE("layer %d not exists or registered", typeindex);
                clear();
                return -1;
            }

            layer_cpu->bottoms = layer->bottoms;
            layer_cpu->tops = layer->tops;
            layer_cpu->bottom_shapes = layer->bottom_shapes;
            layer_cpu->top_shapes = layer->top_shapes;
            layer_cpu->featmask = layer->featmask;

            int lr = layer_cpu->load_param(pd);
            if (lr != 0)
            {
                NCNN_LOGE("layer load_param %d failed", i);
                continue;
            }

            delete layer;
            layer = layer_cpu;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();

#undef READ_VALUE
    return 0;
}